

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInitialNodeOrientation(ChElementShellReissner4 *this)

{
  ChVector<double> *pCVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer psVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChMatrix33<double> *pCVar11;
  long lVar12;
  ChVector<double> *pCVar13;
  ChMatrix33<double> *pCVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ChMatrix33<double> t123;
  ChVector<double> local_f8;
  undefined1 local_d8 [16];
  double local_c8;
  ChVector<double> local_b8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  local_98;
  ChVector<double> *local_88;
  ChMatrix33<double> local_80;
  ChMatrix33<double> *local_38;
  
  psVar5 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = this->xa;
  pCVar13 = pCVar1;
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    lVar6 = *(long *)((long)&(psVar5->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar12);
    if (pCVar13 != (ChVector<double> *)(lVar6 + 0x20)) {
      pCVar13->m_data[0] = *(double *)(lVar6 + 0x20);
      pCVar13->m_data[1] = *(double *)(lVar6 + 0x28);
      pCVar13->m_data[2] = *(double *)(lVar6 + 0x30);
    }
    pCVar13 = pCVar13 + 1;
  }
  pCVar14 = this->iTa;
  local_88 = pCVar1;
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    InterpDeriv_xi1(pCVar1,(double *)(xi_n + lVar12));
    dVar15 = ChVector<double>::Length(&local_f8);
    dVar15 = 1.0 / dVar15;
    local_f8.m_data[2] = dVar15 * local_f8.m_data[2];
    local_f8.m_data[0] = dVar15 * local_f8.m_data[0];
    local_f8.m_data[1] = dVar15 * local_f8.m_data[1];
    InterpDeriv_xi2(pCVar1,(double *)(xi_n + lVar12));
    dVar15 = ChVector<double>::Length((ChVector<double> *)local_d8);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_f8.m_data[2];
    auVar8._8_8_ = local_f8.m_data[1];
    auVar8._0_8_ = local_f8.m_data[0];
    dVar15 = 1.0 / dVar15;
    local_c8 = dVar15 * local_c8;
    local_d8._0_8_ = dVar15 * (double)local_d8._0_8_;
    local_d8._8_8_ = dVar15 * (double)local_d8._8_8_;
    auVar7 = vshufpd_avx(local_d8,local_d8,1);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_f8.m_data[1];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_c8;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar7._0_8_ * local_f8.m_data[2];
    auVar27 = vfmsub231sd_fma(auVar34,auVar19,auVar3);
    auVar7 = vunpcklpd_avx(auVar19,local_d8);
    auVar33 = vunpcklpd_avx(auVar28,auVar8);
    auVar20._0_8_ = auVar7._0_8_ * local_f8.m_data[0];
    auVar20._8_8_ = auVar7._8_8_ * local_f8.m_data[1];
    auVar7 = vfmsub213pd_fma(auVar33,local_d8,auVar20);
    local_b8.m_data[0] = auVar27._0_8_;
    local_b8.m_data[1] = auVar7._0_8_;
    local_b8.m_data[2] = auVar7._8_8_;
    dVar15 = ChVector<double>::Length(&local_b8);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_f8.m_data[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_f8.m_data[0];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_f8.m_data[2];
    local_98.m_rhs = &local_80.super_Matrix<double,_3,_3,_1,_3,_3>;
    dVar15 = 1.0 / dVar15;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_f8.m_data[0];
    local_b8.m_data[2] = dVar15 * local_b8.m_data[2];
    auVar16._0_8_ = dVar15 * local_b8.m_data[0];
    auVar16._8_8_ = dVar15 * local_b8.m_data[1];
    auVar7 = vshufpd_avx(auVar16,auVar16,1);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_f8.m_data[1] * local_b8.m_data[2];
    auVar33 = vfmsub231sd_fma(auVar43,auVar7,auVar29);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_b8.m_data[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_f8.m_data[2] * auVar16._0_8_;
    auVar27 = vfmsub231sd_fma(auVar49,auVar21,auVar35);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_f8.m_data[0] * auVar7._0_8_;
    auVar7 = vfmsub231sd_fma(auVar46,auVar16,auVar40);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar33._0_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)vmovlpd_avx(auVar16);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_f8.m_data[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar27._0_8_;
    local_d8._8_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_d8._0_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)vmovhpd_avx(auVar16);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_f8.m_data[2];
    local_c8 = auVar7._0_8_;
    local_98.m_lhs.m_matrix =
         (non_const_type)
         (*(long *)((long)&(((this->m_nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar12) + 0x58);
    local_b8.m_data[0] = auVar16._0_8_;
    local_b8.m_data[1] = auVar16._8_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_c8;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_b8.m_data[2];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&pCVar14->super_Matrix<double,_3,_3,_1,_3,_3>,&local_98);
    pCVar14 = pCVar14 + 1;
  }
  local_38 = this->iTa_i;
  for (lVar12 = 0x26a8; lVar12 != 0x27c8; lVar12 = lVar12 + 0x48) {
    ChMatrix33<double>::ChMatrix33(&local_80,1.0);
    *(double *)
     ((long)(this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
            m_storage.m_data.array + lVar12 + -0x80) =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    pdVar2 = (double *)
             ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar12);
    *pdVar2 = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
    ;
    pdVar2[1] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    pdVar2[2] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
    pdVar2[3] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    pdVar2[4] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    pdVar2[5] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
    pdVar2[6] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    pdVar2[7] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  }
  pCVar14 = this->iTa_A;
  lVar12 = 0x27c8;
  while( true ) {
    if (lVar12 == 0x28e8) break;
    ChMatrix33<double>::ChMatrix33(&local_80,1.0);
    *(double *)
     ((long)(this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
            m_storage.m_data.array + lVar12 + -0x80) =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    pdVar2 = (double *)
             ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar12);
    *pdVar2 = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
    ;
    pdVar2[1] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    pdVar2[2] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
    pdVar2[3] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    pdVar2[4] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    pdVar2[5] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
    pdVar2[6] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    pdVar2[7] = local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    lVar12 = lVar12 + 0x48;
  }
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  for (lVar12 = 0; pCVar1 = local_88, lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    InterpDeriv_xi1(local_88,(double *)((long)&xi_i + lVar12));
    dVar15 = ChVector<double>::Length(&local_f8);
    dVar15 = 1.0 / dVar15;
    local_f8.m_data[2] = dVar15 * local_f8.m_data[2];
    local_f8.m_data[0] = dVar15 * local_f8.m_data[0];
    local_f8.m_data[1] = dVar15 * local_f8.m_data[1];
    InterpDeriv_xi2(pCVar1,(double *)((long)&xi_i + lVar12));
    dVar15 = ChVector<double>::Length((ChVector<double> *)local_d8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_f8.m_data[2];
    auVar9._8_8_ = local_f8.m_data[1];
    auVar9._0_8_ = local_f8.m_data[0];
    dVar15 = 1.0 / dVar15;
    local_c8 = dVar15 * local_c8;
    local_d8._0_8_ = dVar15 * (double)local_d8._0_8_;
    local_d8._8_8_ = dVar15 * (double)local_d8._8_8_;
    auVar7 = vshufpd_avx(local_d8,local_d8,1);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_f8.m_data[1];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_c8;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auVar7._0_8_ * local_f8.m_data[2];
    auVar27 = vfmsub231sd_fma(auVar36,auVar22,auVar4);
    auVar7 = vunpcklpd_avx(auVar22,local_d8);
    auVar33 = vunpcklpd_avx(auVar30,auVar9);
    auVar23._0_8_ = auVar7._0_8_ * local_f8.m_data[0];
    auVar23._8_8_ = auVar7._8_8_ * local_f8.m_data[1];
    auVar7 = vfmsub213pd_fma(auVar33,local_d8,auVar23);
    local_b8.m_data[0] = auVar27._0_8_;
    local_b8.m_data[1] = auVar7._0_8_;
    local_b8.m_data[2] = auVar7._8_8_;
    dVar15 = ChVector<double>::Length(&local_b8);
    pCVar11 = local_38;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_f8.m_data[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_f8.m_data[0];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_f8.m_data[2];
    local_98.m_lhs.m_matrix = (non_const_type)((long)(local_38 + 0x18) + 0x18);
    local_98.m_rhs = &local_80.super_Matrix<double,_3,_3,_1,_3,_3>;
    dVar15 = 1.0 / dVar15;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_f8.m_data[0];
    local_b8.m_data[2] = dVar15 * local_b8.m_data[2];
    auVar17._0_8_ = dVar15 * local_b8.m_data[0];
    auVar17._8_8_ = dVar15 * local_b8.m_data[1];
    auVar7 = vshufpd_avx(auVar17,auVar17,1);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_f8.m_data[1] * local_b8.m_data[2];
    auVar33 = vfmsub231sd_fma(auVar44,auVar7,auVar31);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_b8.m_data[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_f8.m_data[2] * auVar17._0_8_;
    auVar27 = vfmsub231sd_fma(auVar50,auVar24,auVar37);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_f8.m_data[0] * auVar7._0_8_;
    auVar7 = vfmsub231sd_fma(auVar47,auVar17,auVar41);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar33._0_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)vmovlpd_avx(auVar17);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_f8.m_data[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar27._0_8_;
    local_d8._8_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_d8._0_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)vmovhpd_avx(auVar17);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_f8.m_data[2];
    local_c8 = auVar7._0_8_;
    local_b8.m_data[0] = auVar17._0_8_;
    local_b8.m_data[1] = auVar17._8_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_c8;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_b8.m_data[2];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_38->super_Matrix<double,_3,_3,_1,_3,_3>,&local_98);
    local_38 = pCVar11 + 1;
  }
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    InterpDeriv_xi1(pCVar1,(double *)(xi_A + lVar12));
    dVar15 = ChVector<double>::Length(&local_f8);
    dVar15 = 1.0 / dVar15;
    local_f8.m_data[2] = dVar15 * local_f8.m_data[2];
    local_f8.m_data[0] = dVar15 * local_f8.m_data[0];
    local_f8.m_data[1] = dVar15 * local_f8.m_data[1];
    InterpDeriv_xi2(pCVar1,(double *)(xi_A + lVar12));
    dVar15 = ChVector<double>::Length((ChVector<double> *)local_d8);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_f8.m_data[2];
    auVar10._8_8_ = local_f8.m_data[1];
    auVar10._0_8_ = local_f8.m_data[0];
    dVar15 = 1.0 / dVar15;
    local_c8 = dVar15 * local_c8;
    local_d8._0_8_ = dVar15 * (double)local_d8._0_8_;
    local_d8._8_8_ = dVar15 * (double)local_d8._8_8_;
    auVar33 = vshufpd_avx(local_d8,local_d8,1);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_f8.m_data[1];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_c8;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auVar33._0_8_ * local_f8.m_data[2];
    auVar27 = vfmsub231sd_fma(auVar38,auVar25,auVar7);
    auVar7 = vunpcklpd_avx(auVar25,local_d8);
    auVar33 = vunpcklpd_avx(auVar32,auVar10);
    auVar26._0_8_ = auVar7._0_8_ * local_f8.m_data[0];
    auVar26._8_8_ = auVar7._8_8_ * local_f8.m_data[1];
    auVar7 = vfmsub213pd_fma(auVar33,local_d8,auVar26);
    local_b8.m_data[0] = auVar27._0_8_;
    local_b8.m_data[1] = auVar7._0_8_;
    local_b8.m_data[2] = auVar7._8_8_;
    dVar15 = ChVector<double>::Length(&local_b8);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_f8.m_data[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_f8.m_data[0];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_f8.m_data[2];
    local_98.m_lhs.m_matrix = (non_const_type)((long)(pCVar14 + 0x18) + 0x18);
    local_98.m_rhs = &local_80.super_Matrix<double,_3,_3,_1,_3,_3>;
    dVar15 = 1.0 / dVar15;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_f8.m_data[0];
    local_b8.m_data[2] = dVar15 * local_b8.m_data[2];
    auVar18._0_8_ = dVar15 * local_b8.m_data[0];
    auVar18._8_8_ = dVar15 * local_b8.m_data[1];
    auVar7 = vshufpd_avx(auVar18,auVar18,1);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_f8.m_data[1] * local_b8.m_data[2];
    auVar33 = vfmsub231sd_fma(auVar45,auVar7,auVar33);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_b8.m_data[2];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_f8.m_data[2] * auVar18._0_8_;
    auVar27 = vfmsub231sd_fma(auVar51,auVar27,auVar39);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_f8.m_data[0] * auVar7._0_8_;
    auVar7 = vfmsub231sd_fma(auVar48,auVar18,auVar42);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar33._0_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)vmovlpd_avx(auVar18);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_f8.m_data[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar27._0_8_;
    local_d8._8_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_d8._0_8_ =
         local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)vmovhpd_avx(auVar18);
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_f8.m_data[2];
    local_c8 = auVar7._0_8_;
    local_b8.m_data[0] = auVar18._0_8_;
    local_b8.m_data[1] = auVar18._8_8_;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_c8;
    local_80.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_b8.m_data[2];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&pCVar14->super_Matrix<double,_3,_3,_1,_3,_3>,&local_98);
    pCVar14 = pCVar14 + 1;
  }
  InterpolateOrientation(this);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInitialNodeOrientation() {
    for (int i = 0; i < NUMNODES; i++) {
        xa[i] = this->m_nodes[i]->GetPos();
    }
    for (int i = 0; i < NUMNODES; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_n[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_n[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa[i] = m_nodes[i]->GetA().transpose() * t123;
    }
    for (int i = 0; i < NUMIP; i++) {
        iTa_i[i] = ChMatrix33<>(1);
    }
    for (int i = 0; i < NUMSSEP; i++) {
        iTa_A[i] = ChMatrix33<>(1);
    }
    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();
    for (int i = 0; i < NUMIP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_i[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_i[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_i[i] = T_i[i].transpose() * t123;
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_A[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_A[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_A[i] = T_A[i].transpose() * t123;
    }
    InterpolateOrientation();
}